

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datastructure.h
# Opt level: O2

bool next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                index,unsigned_long k,unsigned_long n)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = index._M_current[k - 1];
  if (uVar2 < n) {
    if ((ulong)uVar2 < n - 1) {
      index._M_current[k - 1] = uVar2 + 1;
      return true;
    }
    if (k != 1) {
      for (uVar1 = k - 1; uVar1 != 1; uVar1 = uVar1 - 1) {
        uVar2 = index._M_current[uVar1 - 1];
        if (uVar2 != index._M_current[uVar1] - 1) goto LAB_0010d064;
      }
      uVar2 = *index._M_current;
      if (uVar2 != index._M_current[1] - 1) {
LAB_0010d064:
        index._M_current[uVar1 - 1] = uVar2 + 1;
        uVar2 = uVar2 + 2;
        for (; uVar1 < k; uVar1 = uVar1 + 1) {
          index._M_current[uVar1] = uVar2;
          uVar2 = uVar2 + 1;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool next_combination(RandomAccessIterator index, uint k, uint n) {
    auto &last = index[k-1];
    if (last >= n) return false;
    if (last < n - 1) {
        ++last;
        return true;
    }
    if (k == 1) return false;
    uint i = k - 2;
    while (i > 0 && index[i] == index[i+1] - 1) --i;
    if (i == 0 && index[i] == index[i+1] - 1) return false;
    ++index[i];
    while (++i < k) {
        index[i] = index[i-1] + 1;
    }
    return true;
}